

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceGLImpl::CreateDummyTexture
          (RenderDeviceGLImpl *this,TextureDesc *TexDesc,RESOURCE_STATE InitialState,
          ITexture **ppTexture)

{
  anon_class_24_3_c9f2851e ConstructObject;
  ITexture **local_28;
  ITexture **ppTexture_local;
  TextureDesc *pTStack_18;
  RESOURCE_STATE InitialState_local;
  TextureDesc *TexDesc_local;
  RenderDeviceGLImpl *this_local;
  
  ConstructObject.this = this;
  ConstructObject.TexDesc = TexDesc;
  ConstructObject.ppTexture = &local_28;
  local_28 = ppTexture;
  ppTexture_local._4_4_ = InitialState;
  pTStack_18 = TexDesc;
  TexDesc_local = (TextureDesc *)this;
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateDeviceObject<Diligent::ITexture,Diligent::TextureDesc,Diligent::RenderDeviceGLImpl::CreateDummyTexture(Diligent::TextureDesc_const&,Diligent::RESOURCE_STATE,Diligent::ITexture**)::__0>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,"texture",TexDesc,ppTexture
             ,ConstructObject);
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateDummyTexture(const TextureDesc& TexDesc, RESOURCE_STATE InitialState, ITexture** ppTexture)
{
    CreateDeviceObject(
        "texture", TexDesc, ppTexture,
        [&]() //
        {
            TextureBaseGL* pTextureOGL = nullptr;
            switch (TexDesc.Type)
            {
                case RESOURCE_DIM_TEX_2D:
                    pTextureOGL = NEW_RC_OBJ(m_TexObjAllocator, "Dummy Texture2D_GL instance", Texture2D_GL)(m_TexViewObjAllocator, this, TexDesc);
                    break;

                default: LOG_ERROR_AND_THROW("Unsupported texture type.");
            }

            pTextureOGL->QueryInterface(IID_Texture, reinterpret_cast<IObject**>(ppTexture));
            pTextureOGL->CreateDefaultViews();
        } //
    );
}